

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O2

void cvui::handleMouse(int theEvent,int theX,int theY,int theFlags,void *theData)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined1 uVar4;
  
  lVar3 = 0;
  do {
    if (lVar3 == 0xc) {
      *(int *)((long)theData + 0x2c) = theX;
      *(int *)((long)theData + 0x30) = theY;
      return;
    }
    lVar1 = (long)*(int *)((long)&DAT_0011a0e4 + lVar3) * 3;
    if (*(int *)((long)&DAT_0011a0f0 + lVar3) == theEvent) {
      *(undefined2 *)((long)theData + 0x2a) = 0x101;
      lVar2 = lVar1 + 0x21;
      uVar4 = 1;
LAB_00108fa3:
      *(undefined1 *)((long)theData + lVar2) = 1;
      *(undefined1 *)((long)theData + lVar1 + 0x22) = uVar4;
    }
    else if (*(int *)(&DAT_0011a0fc + lVar3) == theEvent) {
      *(undefined1 *)((long)theData + 0x29) = 1;
      *(undefined1 *)((long)theData + 0x2b) = 0;
      lVar2 = lVar1 + 0x20;
      uVar4 = 0;
      goto LAB_00108fa3;
    }
    lVar3 = lVar3 + 4;
  } while( true );
}

Assistant:

void handleMouse(int theEvent, int theX, int theY, int theFlags, void* theData) {
	int aButtons[3] = { cvui::LEFT_BUTTON, cvui::MIDDLE_BUTTON, cvui::RIGHT_BUTTON };
	int aEventsDown[3] = { cv::EVENT_LBUTTONDOWN, cv::EVENT_MBUTTONDOWN, cv::EVENT_RBUTTONDOWN };
	int aEventsUp[3] = { cv::EVENT_LBUTTONUP, cv::EVENT_MBUTTONUP, cv::EVENT_RBUTTONUP };

	cvui_context_t *aContext = (cvui_context_t *)theData;

	for (int i = 0; i < 3; i++) {
		int aBtn = aButtons[i];

		if (theEvent == aEventsDown[i]) {
			aContext->mouse.anyButton.justPressed = true;
			aContext->mouse.anyButton.pressed = true;
			aContext->mouse.buttons[aBtn].justPressed = true;
			aContext->mouse.buttons[aBtn].pressed = true;

		} else if (theEvent == aEventsUp[i]) {
			aContext->mouse.anyButton.justReleased = true;
			aContext->mouse.anyButton.pressed = false;
			aContext->mouse.buttons[aBtn].justReleased = true;
			aContext->mouse.buttons[aBtn].pressed = false;
		}
	}

	aContext->mouse.position.x = theX;
	aContext->mouse.position.y = theY;
}